

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

void __thiscall
cmGraphVizWriter::WriteHeader(cmGraphVizWriter *this,cmGeneratedFileStream *fs,string *name)

{
  ostream *poVar1;
  undefined1 local_40 [8];
  string escapedGraphName;
  string *name_local;
  cmGeneratedFileStream *fs_local;
  cmGraphVizWriter *this_local;
  
  escapedGraphName.field_2._8_8_ = name;
  EscapeForDotFile((string *)local_40,name);
  poVar1 = std::operator<<((ostream *)fs,"digraph \"");
  poVar1 = std::operator<<(poVar1,(string *)local_40);
  poVar1 = std::operator<<(poVar1,"\" {\n");
  poVar1 = std::operator<<(poVar1,(string *)&this->GraphHeader);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmGraphVizWriter::WriteHeader(cmGeneratedFileStream& fs,
                                   const std::string& name)
{
  auto const escapedGraphName = EscapeForDotFile(name);
  fs << "digraph \"" << escapedGraphName << "\" {\n"
     << this->GraphHeader << '\n';
}